

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_log.cpp
# Opt level: O0

void cubeb_log_internal(char *file,uint32_t line,char *fmt,...)

{
  __pointer_type p_Var1;
  char *in_RDX;
  uint in_ESI;
  undefined8 in_RDI;
  char msg [256];
  va_list args;
  atomic<void_(*)(const_char_*,____)> *in_stack_fffffffffffffe18;
  char local_138 [256];
  undefined4 local_38;
  undefined4 local_34;
  undefined1 *local_30;
  undefined1 *local_28;
  char *local_18;
  uint local_c;
  undefined8 local_8;
  
  local_28 = &stack0xfffffffffffffe18;
  local_30 = &stack0x00000008;
  local_34 = 0x30;
  local_38 = 0x18;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  vsnprintf(local_138,0x100,in_RDX,&local_38);
  p_Var1 = std::atomic<void_(*)(const_char_*,_...)>::load
                     (in_stack_fffffffffffffe18,(memory_order)((ulong)local_138 >> 0x20));
  (*p_Var1)("%s:%d:%s",local_8,(ulong)local_c,local_138);
  return;
}

Assistant:

void
cubeb_log_internal(char const * file, uint32_t line, char const * fmt, ...)
{
  va_list args;
  va_start(args, fmt);
  char msg[CUBEB_LOG_MESSAGE_MAX_SIZE];
  vsnprintf(msg, CUBEB_LOG_MESSAGE_MAX_SIZE, fmt, args);
  va_end(args);
  g_cubeb_log_callback.load()("%s:%d:%s", file, line, msg);
}